

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.h
# Opt level: O1

void __thiscall GdlNumericExpression::GdlNumericExpression(GdlNumericExpression *this,int nValue)

{
  GdlObject::GdlObject((GdlObject *)&this->field_0x8);
  *(undefined4 *)&this->field_0x30 = 0;
  *(undefined ***)this = &PTR_Clone_00241fc8;
  this->m_nValue = nValue;
  this->m_munits = -1;
  this->m_fBoolean = false;
  GdlExpression::SetType((GdlExpression *)this,kexptNumber);
  return;
}

Assistant:

GdlNumericExpression(int nValue)
		:	GdlSimpleExpression(),
			m_nValue(nValue),
			m_munits(kmunitNone),
			m_fBoolean(false)
	{
		SetType(kexptNumber);
	}